

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkdiskcache.cpp
# Opt level: O2

void __thiscall QNetworkDiskCachePrivate::prepareLayout(QNetworkDiskCachePrivate *this)

{
  long lVar1;
  uint i;
  int iVar2;
  long in_FS_OFFSET;
  QStringBuilder<QString_&,_QString_&> local_88;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  QDir helper;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _helper = &DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  local_58.size = 0;
  QDir::QDir(&helper,(QString *)&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QDir::mkpath(&helper,&this->dataDirectory,0);
  for (iVar2 = 0; iVar2 != 0x10; iVar2 = iVar2 + 1) {
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QString::number((uint)&local_58,iVar2);
    local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_88.a = &this->dataDirectory;
    local_88.b = (QString *)&local_58;
    QStringBuilder<QString_&,_QString_&>::convertTo<QString>((QString *)&local_78,&local_88);
    QDir::mkdir(&helper,&local_78,0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  }
  QDir::~QDir(&helper);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkDiskCachePrivate::prepareLayout()
{
    QDir helper;

    //Create directory and subdirectories 0-F
    helper.mkpath(dataDirectory);
    for (uint i = 0; i < 16 ; i++) {
        QString str = QString::number(i, 16);
        QString subdir = dataDirectory + str;
        helper.mkdir(subdir);
    }
}